

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall chrono::ChArchiveIn::in<char,200ul>(ChArchiveIn *this,ChNameValue<char[200]> *bVal)

{
  ulong uVar1;
  ChExceptionArchive *this_00;
  size_t i;
  ulong uVar2;
  allocator local_b9;
  size_t arraysize;
  char *local_b0;
  char *local_a8;
  undefined1 local_a0;
  char element;
  char idname [20];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (**(code **)(*(long *)this + 0x70))(this,bVal->_name,&arraysize);
  if (arraysize == 200) {
    uVar1 = 200;
    for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
      sprintf(idname,"%lu",uVar2);
      local_a0 = 0;
      local_b0 = idname;
      local_a8 = &element;
      (**(code **)(*(long *)this + 0x30))(this,&local_b0);
      (*bVal->_value)[uVar2] = element;
      (**(code **)(*(long *)this + 0x78))(this,bVal->_name);
      uVar1 = arraysize;
    }
    (**(code **)(*(long *)this + 0x80))(this,bVal->_name);
    return;
  }
  this_00 = (ChExceptionArchive *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&element,bVal->_name,&local_b9);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)idname,
                 "Size of [] saved array does not match size of receiver array ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&element);
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)idname,".");
  ChExceptionArchive::ChExceptionArchive(this_00,&local_50);
  __cxa_throw(this_00,&ChExceptionArchive::typeinfo,ChException::~ChException);
}

Assistant:

void in     (ChNameValue<T[N]> bVal) {
          size_t arraysize;
          this->in_array_pre(bVal.name(), arraysize);
          if (arraysize != sizeof(bVal.value())/sizeof(T) ) {throw (ChExceptionArchive( "Size of [] saved array does not match size of receiver array " + std::string(bVal.name()) + "."));}
          for (size_t i = 0; i<arraysize; ++i)
          {
              char idname[20];
              sprintf(idname, "%lu", (unsigned long)i);
              T element;
              ChNameValue< T > array_val(idname, element);
              this->in (array_val);
              bVal.value()[i]=element;
              this->in_array_between(bVal.name());
          }
          this->in_array_end(bVal.name());
      }